

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  ImportInfo *pIVar3;
  char *__s;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *clr;
  ImportInfo *info;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  info = (ImportInfo *)config;
  config_local = (string *)this;
  TVar2 = GetType(this);
  if ((int)TVar2 < 3) {
    TVar2 = GetType(this);
    if (TVar2 == STATIC_LIBRARY) {
      this_local._4_4_ = Native;
    }
    else {
      bVar1 = IsImported(this);
      if (bVar1) {
        pIVar3 = GetImportInfo(this,(string *)info);
        if (pIVar3 == (ImportInfo *)0x0) {
          this_local._4_4_ = Undefined;
        }
        else {
          this_local._4_4_ = pIVar3->Managed;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"COMMON_LANGUAGE_RUNTIME",&local_51);
        __s = GetProperty(this,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::allocator<char>::~allocator(&local_51);
        local_30 = __s;
        if (__s == (char *)0x0) {
          bVar1 = IsCSharpOnly(this);
          this_local._4_4_ = Native;
          if (bVar1) {
            this_local._4_4_ = Managed;
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
          this_local._4_4_ = CheckManagedType(this,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::allocator<char>::~allocator(&local_89);
        }
      }
    }
  }
  else {
    this_local._4_4_ = Undefined;
  }
  return this_local._4_4_;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (auto* clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}